

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<int,int,int>
          (Capturer *this,size_t index,int *value,int *values,int *values_1)

{
  string local_50;
  int *local_30;
  int *values_local_1;
  int *values_local;
  int *value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_30 = values_1;
  values_local_1 = values;
  values_local = value;
  value_local = (int *)index;
  index_local = (size_t)this;
  Detail::stringify<int>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<int,int>(this,(long)value_local + 1,values_local_1,local_30);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }